

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_ordinaryFunction_nativeApply
          (sysbvm_context_t *context,sysbvm_tuple_t function,
          sysbvm_functionEntryPoint_t nativeEntryPoint,size_t argumentCount,
          sysbvm_tuple_t *arguments,sysbvm_bitflags_t applicationFlags)

{
  sysbvm_tuple_t sVar1;
  sysbvm_stackFrameGCRootsRecord_t argumentsRecord;
  sysbvm_stackFrameRecord_t local_50;
  size_t local_40;
  sysbvm_tuple_t *local_38;
  
  local_50.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_50.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_40 = argumentCount;
  local_38 = arguments;
  sysbvm_stackFrame_pushRecord(&local_50);
  sVar1 = (*nativeEntryPoint)(context,function,argumentCount,arguments);
  sysbvm_stackFrame_popRecord(&local_50);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_ordinaryFunction_nativeApply(sysbvm_context_t *context, sysbvm_tuple_t function, sysbvm_functionEntryPoint_t nativeEntryPoint, size_t argumentCount, sysbvm_tuple_t *arguments, sysbvm_bitflags_t applicationFlags)
{
    (void)applicationFlags;
    sysbvm_stackFrameGCRootsRecord_t argumentsRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS,
        .rootCount = argumentCount,
        .roots = arguments
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);

    sysbvm_tuple_t result = nativeEntryPoint(context, function, argumentCount, arguments);
        
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);
    return result;
}